

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.cc
# Opt level: O2

int X509_PUBKEY_set(X509_PUBKEY **x,EVP_PKEY *pkey)

{
  int line;
  int iVar1;
  X509_PUBKEY *a;
  uint8_t *spki;
  uint8_t *p;
  size_t spki_len;
  CBB cbb;
  
  spki = (uint8_t *)0x0;
  if (x != (X509_PUBKEY **)0x0) {
    iVar1 = CBB_init(&cbb,0);
    if (((iVar1 == 0) || (iVar1 = EVP_marshal_public_key(&cbb,(EVP_PKEY *)pkey), iVar1 == 0)) ||
       (iVar1 = CBB_finish(&cbb,&spki,&spki_len), (long)spki_len < 0 || iVar1 == 0)) {
      CBB_cleanup(&cbb);
      a = (X509_PUBKEY *)0x0;
      iVar1 = 0x7e;
      line = 0x5e;
    }
    else {
      p = spki;
      a = d2i_X509_PUBKEY((X509_PUBKEY **)0x0,&p,spki_len);
      if ((a != (X509_PUBKEY *)0x0) && (p == spki + spki_len)) {
        OPENSSL_free(spki);
        X509_PUBKEY_free(*x);
        *x = a;
        return 1;
      }
      iVar1 = 0x7d;
      line = 0x65;
    }
    ERR_put_error(0xb,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_pubkey.cc"
                  ,line);
    X509_PUBKEY_free(a);
    OPENSSL_free(spki);
  }
  return 0;
}

Assistant:

int X509_PUBKEY_set(X509_PUBKEY **x, EVP_PKEY *pkey) {
  X509_PUBKEY *pk = NULL;
  uint8_t *spki = NULL;
  size_t spki_len;

  if (x == NULL) {
    return 0;
  }

  CBB cbb;
  const uint8_t *p;
  if (!CBB_init(&cbb, 0) ||  //
      !EVP_marshal_public_key(&cbb, pkey) ||
      !CBB_finish(&cbb, &spki, &spki_len) ||  //
      spki_len > LONG_MAX) {
    CBB_cleanup(&cbb);
    OPENSSL_PUT_ERROR(X509, X509_R_PUBLIC_KEY_ENCODE_ERROR);
    goto error;
  }

  p = spki;
  pk = d2i_X509_PUBKEY(NULL, &p, (long)spki_len);
  if (pk == NULL || p != spki + spki_len) {
    OPENSSL_PUT_ERROR(X509, X509_R_PUBLIC_KEY_DECODE_ERROR);
    goto error;
  }

  OPENSSL_free(spki);
  X509_PUBKEY_free(*x);
  *x = pk;

  return 1;
error:
  X509_PUBKEY_free(pk);
  OPENSSL_free(spki);
  return 0;
}